

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_cbc3_setiv(ssh_cipher *ciph,void *viv)

{
  LR LVar1;
  ulong local_38;
  size_t i;
  LR iv;
  des3_cbc3_ctx *ctx;
  void *viv_local;
  ssh_cipher *ciph_local;
  
  LVar1 = des_load_lr(viv);
  LVar1 = des_IP(LVar1);
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    *(LR *)(ciph + (local_38 - 3)) = LVar1;
  }
  return;
}

Assistant:

static void des3_cbc3_setiv(ssh_cipher *ciph, const void *viv)
{
    struct des3_cbc3_ctx *ctx = container_of(ciph, struct des3_cbc3_ctx, ciph);

    /*
     * In principle, we ought to provide an interface for the user to
     * input 24 instead of 8 bytes of IV. But that would make this an
     * ugly exception to the otherwise universal rule that IV size =
     * cipher block size, and there's really no need to violate that
     * rule given that this is a historical one-off oddity and SSH-1
     * always initialises all three IVs to zero anyway. So we fudge it
     * by just setting all the IVs to the same value.
     */

    LR iv = des_load_lr(viv);

    /* But we store the IVs in permuted form, so that we can handle
     * all three CBC layers without having to do IP/FP in between. */
    iv = des_IP(iv);
    for (size_t i = 0; i < 3; i++)
        ctx->iv[i] = iv;
}